

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP5Deserializer::InstallAttributesV2
          (BP5Deserializer *this,FFSTypeHandle FFSformat,void *BaseData,size_t Step)

{
  undefined8 *puVar1;
  ulong uVar2;
  complex<double> *pcVar3;
  ulong uVar4;
  complex<float> *pcVar5;
  float *pfVar6;
  uint *puVar7;
  int *piVar8;
  uchar *puVar9;
  unsigned_long *puVar10;
  long *plVar11;
  double *pdVar12;
  short *psVar13;
  unsigned_short *puVar14;
  longdouble *plVar15;
  char *pcVar16;
  IO *pIVar17;
  BP5Deserializer *pBVar18;
  undefined8 array_00;
  undefined8 uVar19;
  int iVar20;
  ostream *poVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  size_t sVar23;
  DataType type;
  DataType type_00;
  pointer pcVar24;
  char *pcVar25;
  _Alloc_hider _Var26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  array;
  string local_480;
  string local_460;
  BP5Deserializer *local_440;
  IO *local_438;
  allocator local_429;
  undefined1 local_428 [32];
  ulong *local_408;
  ulong local_400;
  char *local_3f8;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_440 = this;
  local_408 = (ulong *)BaseData;
  if (*BaseData != 0) {
    lVar27 = 0x10;
    uVar28 = 0;
    do {
      pBVar18 = local_440;
      uVar2 = local_408[1];
      pcVar25 = *(char **)((uVar2 - 0x10) + lVar27);
      iVar20 = (int)*pcVar25;
      pcVar25 = pcVar25 + 1;
      uVar30 = iVar20 - 0x42;
      if (iVar20 < 0x43) {
        uVar30 = iVar20 - 0x30;
      }
      if (iVar20 < 0x43) {
        switch(uVar30 - 1) {
        case 0:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          pcVar25 = *(char **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/","");
          core::IO::DefineAttribute<signed_char>
                    (pIVar17,&local_480,pcVar25,&local_460,&local_270,true);
          paVar22 = &local_270.field_2;
          _Var26._M_p = local_270._M_dataplus._M_p;
          break;
        case 1:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          psVar13 = *(short **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"/","");
          core::IO::DefineAttribute<short>(pIVar17,&local_480,psVar13,&local_460,&local_290,true);
          paVar22 = &local_290.field_2;
          _Var26._M_p = local_290._M_dataplus._M_p;
          break;
        case 2:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          piVar8 = *(int **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"/","");
          core::IO::DefineAttribute<int>(pIVar17,&local_480,piVar8,&local_460,&local_2b0,true);
          paVar22 = &local_2b0.field_2;
          _Var26._M_p = local_2b0._M_dataplus._M_p;
          break;
        case 3:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          plVar11 = *(long **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"/","");
          core::IO::DefineAttribute<long>(pIVar17,&local_480,plVar11,&local_460,&local_2d0,true);
          paVar22 = &local_2d0.field_2;
          _Var26._M_p = local_2d0._M_dataplus._M_p;
          break;
        case 4:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          puVar9 = *(uchar **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"/","");
          core::IO::DefineAttribute<unsigned_char>
                    (pIVar17,&local_480,puVar9,&local_460,&local_2f0,true);
          paVar22 = &local_2f0.field_2;
          _Var26._M_p = local_2f0._M_dataplus._M_p;
          break;
        case 5:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          puVar14 = *(unsigned_short **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"/","");
          core::IO::DefineAttribute<unsigned_short>
                    (pIVar17,&local_480,puVar14,&local_460,&local_310,true);
          paVar22 = &local_310.field_2;
          _Var26._M_p = local_310._M_dataplus._M_p;
          break;
        case 6:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          puVar7 = *(uint **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"/","");
          core::IO::DefineAttribute<unsigned_int>
                    (pIVar17,&local_480,puVar7,&local_460,&local_330,true);
          paVar22 = &local_330.field_2;
          _Var26._M_p = local_330._M_dataplus._M_p;
          break;
        case 7:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          puVar10 = *(unsigned_long **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"/","");
          core::IO::DefineAttribute<unsigned_long>
                    (pIVar17,&local_480,puVar10,&local_460,&local_350,true);
          paVar22 = &local_350.field_2;
          _Var26._M_p = local_350._M_dataplus._M_p;
          break;
        case 8:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          pfVar6 = *(float **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"/","");
          core::IO::DefineAttribute<float>(pIVar17,&local_480,pfVar6,&local_460,&local_370,true);
          paVar22 = &local_370.field_2;
          _Var26._M_p = local_370._M_dataplus._M_p;
          break;
        case 9:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          pdVar12 = *(double **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"/","");
          core::IO::DefineAttribute<double>(pIVar17,&local_480,pdVar12,&local_460,&local_390,true);
          paVar22 = &local_390.field_2;
          _Var26._M_p = local_390._M_dataplus._M_p;
          break;
        case 10:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          plVar15 = *(longdouble **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"/","");
          core::IO::DefineAttribute<long_double>
                    (pIVar17,&local_480,plVar15,&local_460,&local_3b0,true);
          paVar22 = &local_3b0.field_2;
          _Var26._M_p = local_3b0._M_dataplus._M_p;
          break;
        case 0xb:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          pcVar5 = *(complex<float> **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"/","");
          core::IO::DefineAttribute<std::complex<float>>
                    (pIVar17,&local_480,pcVar5,&local_460,&local_3d0,true);
          paVar22 = &local_3d0.field_2;
          _Var26._M_p = local_3d0._M_dataplus._M_p;
          break;
        case 0xc:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          pcVar3 = *(complex<double> **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"/","");
          core::IO::DefineAttribute<std::complex<double>>
                    (pIVar17,&local_480,pcVar3,&local_460,&local_3f0,true);
          paVar22 = &local_3f0.field_2;
          _Var26._M_p = local_3f0._M_dataplus._M_p;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Loading attribute matched no type ",0x22);
          ToString_abi_cxx11_(&local_480,(adios2 *)(ulong)uVar30,type_00);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_480._M_dataplus._M_p,
                               local_480._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar21);
          goto LAB_0061b60c;
        case 0xe:
          pIVar17 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          pcVar25 = *(char **)(uVar2 + lVar27);
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"/","");
          core::IO::DefineAttribute<char>(pIVar17,&local_480,pcVar25,&local_460,&local_250,true);
          paVar22 = &local_250.field_2;
          _Var26._M_p = local_250._M_dataplus._M_p;
          break;
        case 0xf:
          goto switchD_00619fa2_caseD_f;
        }
      }
      else {
        switch(uVar30 - 1) {
        case 0:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          pcVar25 = *(char **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/","");
          core::IO::DefineAttribute<signed_char>
                    (local_438,&local_480,pcVar25,uVar4 / uVar2,&local_460,&local_b0,true);
          paVar22 = &local_b0.field_2;
          _Var26._M_p = local_b0._M_dataplus._M_p;
          break;
        case 1:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          psVar13 = *(short **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/","");
          core::IO::DefineAttribute<short>
                    (local_438,&local_480,psVar13,uVar4 / uVar2,&local_460,&local_d0,true);
          paVar22 = &local_d0.field_2;
          _Var26._M_p = local_d0._M_dataplus._M_p;
          break;
        case 2:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          piVar8 = *(int **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/","");
          core::IO::DefineAttribute<int>
                    (local_438,&local_480,piVar8,uVar4 / uVar2,&local_460,&local_f0,true);
          paVar22 = &local_f0.field_2;
          _Var26._M_p = local_f0._M_dataplus._M_p;
          break;
        case 3:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          plVar11 = *(long **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/","");
          core::IO::DefineAttribute<long>
                    (local_438,&local_480,plVar11,uVar4 / uVar2,&local_460,&local_110,true);
          paVar22 = &local_110.field_2;
          _Var26._M_p = local_110._M_dataplus._M_p;
          break;
        case 4:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          puVar9 = *(uchar **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"/","");
          core::IO::DefineAttribute<unsigned_char>
                    (local_438,&local_480,puVar9,uVar4 / uVar2,&local_460,&local_130,true);
          paVar22 = &local_130.field_2;
          _Var26._M_p = local_130._M_dataplus._M_p;
          break;
        case 5:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          puVar14 = *(unsigned_short **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"/","");
          core::IO::DefineAttribute<unsigned_short>
                    (local_438,&local_480,puVar14,uVar4 / uVar2,&local_460,&local_150,true);
          paVar22 = &local_150.field_2;
          _Var26._M_p = local_150._M_dataplus._M_p;
          break;
        case 6:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          puVar7 = *(uint **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/","");
          core::IO::DefineAttribute<unsigned_int>
                    (local_438,&local_480,puVar7,uVar4 / uVar2,&local_460,&local_170,true);
          paVar22 = &local_170.field_2;
          _Var26._M_p = local_170._M_dataplus._M_p;
          break;
        case 7:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          puVar10 = *(unsigned_long **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/","");
          core::IO::DefineAttribute<unsigned_long>
                    (local_438,&local_480,puVar10,uVar4 / uVar2,&local_460,&local_190,true);
          paVar22 = &local_190.field_2;
          _Var26._M_p = local_190._M_dataplus._M_p;
          break;
        case 8:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          pfVar6 = *(float **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/","");
          core::IO::DefineAttribute<float>
                    (local_438,&local_480,pfVar6,uVar4 / uVar2,&local_460,&local_1b0,true);
          paVar22 = &local_1b0.field_2;
          _Var26._M_p = local_1b0._M_dataplus._M_p;
          break;
        case 9:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          pdVar12 = *(double **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"/","");
          core::IO::DefineAttribute<double>
                    (local_438,&local_480,pdVar12,uVar4 / uVar2,&local_460,&local_1d0,true);
          paVar22 = &local_1d0.field_2;
          _Var26._M_p = local_1d0._M_dataplus._M_p;
          break;
        case 10:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          plVar15 = *(longdouble **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/","");
          core::IO::DefineAttribute<long_double>
                    (local_438,&local_480,plVar15,uVar4 / uVar2,&local_460,&local_1f0,true);
          paVar22 = &local_1f0.field_2;
          _Var26._M_p = local_1f0._M_dataplus._M_p;
          break;
        case 0xb:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          pcVar5 = *(complex<float> **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/","");
          core::IO::DefineAttribute<std::complex<float>>
                    (local_438,&local_480,pcVar5,uVar4 / uVar2,&local_460,&local_210,true);
          paVar22 = &local_210.field_2;
          _Var26._M_p = local_210._M_dataplus._M_p;
          break;
        case 0xc:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          pcVar3 = *(complex<double> **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"/","");
          core::IO::DefineAttribute<std::complex<double>>
                    (local_438,&local_480,pcVar3,uVar4 / uVar2,&local_460,&local_230,true);
          paVar22 = &local_230.field_2;
          _Var26._M_p = local_230._M_dataplus._M_p;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Loading attribute matched no type ",0x22);
          ToString_abi_cxx11_(&local_480,(adios2 *)(ulong)uVar30,type);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_480._M_dataplus._M_p,
                               local_480._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar21);
          goto LAB_0061b60c;
        case 0xe:
          local_438 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar23 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar25,pcVar25 + sVar23);
          uVar4 = *(ulong *)((uVar2 - 8) + lVar27);
          pcVar25 = *(char **)(uVar2 + lVar27);
          uVar2 = *(ulong *)((long)&pBVar18->_vptr_BP5Deserializer +
                            (long)(pBVar18->_vptr_BP5Deserializer[-3] + (long)(int)uVar30 * 8));
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/","");
          core::IO::DefineAttribute<char>
                    (local_438,&local_480,pcVar25,uVar4 / uVar2,&local_460,&local_90,true);
          paVar22 = &local_90.field_2;
          _Var26._M_p = local_90._M_dataplus._M_p;
          break;
        case 0xf:
          goto switchD_00619fa2_caseD_f;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var26._M_p != paVar22) {
        operator_delete(_Var26._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p);
      }
LAB_0061b60c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != &local_480.field_2) {
        operator_delete(local_480._M_dataplus._M_p);
      }
      uVar28 = uVar28 + 1;
      lVar27 = lVar27 + 0x18;
    } while (uVar28 < *local_408);
  }
  if (local_408[2] != 0) {
    uVar28 = 0;
    do {
      puVar1 = (undefined8 *)(local_408[3] + uVar28 * 0x18);
      pcVar25 = (char *)*puVar1 + 1;
      local_438 = (IO *)puVar1;
      if (*(char *)*puVar1 < 'C') {
        pIVar17 = local_440->m_Engine->m_IO;
        local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
        sVar23 = strlen(pcVar25);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_480,pcVar25,pcVar25 + sVar23);
        std::__cxx11::string::string
                  ((string *)&local_460,(char *)**(undefined8 **)((long)local_438 + 0x10),&local_429
                  );
        local_428._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_428 + 0x10)
        ;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/","");
        core::IO::DefineAttribute<std::__cxx11::string>
                  (pIVar17,&local_480,&local_460,(string *)local_428,&local_70,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_428 + 0x10))
        {
          operator_delete((void *)local_428._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p);
        }
      }
      else {
        local_428._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_428._8_8_ = (pointer)0x0;
        local_428._16_8_ = (pointer)0x0;
        local_400 = uVar28;
        local_3f8 = pcVar25;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_428,puVar1[1]);
        if (puVar1[1] != 0) {
          lVar27 = puVar1[2];
          lVar29 = 0;
          uVar28 = 0;
          do {
            pcVar25 = *(char **)(lVar27 + uVar28 * 8);
            pcVar16 = *(char **)(local_428._0_8_ + lVar29 + 8);
            pcVar24 = (pointer)(local_428._0_8_ + lVar29);
            strlen(pcVar25);
            std::__cxx11::string::_M_replace((ulong)pcVar24,0,pcVar16,(ulong)pcVar25);
            uVar28 = uVar28 + 1;
            lVar29 = lVar29 + 0x20;
          } while (uVar28 < *(ulong *)((long)local_438 + 8));
        }
        pcVar25 = local_3f8;
        pIVar17 = local_440->m_Engine->m_IO;
        local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
        sVar23 = strlen(local_3f8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_480,pcVar25,pcVar25 + sVar23);
        uVar19 = local_428._8_8_;
        array_00 = local_428._0_8_;
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/","");
        core::IO::DefineAttribute<std::__cxx11::string>
                  (pIVar17,&local_480,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)array_00,
                   (long)(uVar19 - array_00) >> 5,&local_460,&local_50,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        uVar28 = local_400;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_428);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 < local_408[2]);
  }
switchD_00619fa2_caseD_f:
  return;
}

Assistant:

void BP5Deserializer::InstallAttributesV2(FFSTypeHandle FFSformat, void *BaseData, size_t Step)
{
    BP5AttrStruct *Attrs = (BP5AttrStruct *)BaseData;

    auto lf_BreakdownTypeArray = [](const char *Name, DataType &Type, bool &Array) {
        Type = (DataType)(Name[0] - '0');
        Array = false;
        if ((int)Type > 18)
        {
            Type = (DataType)((int)Type - 18);
            Array = true;
        }
    };

    for (size_t i = 0; i < Attrs->PrimAttrCount; i++)
    {
        PrimitiveTypeAttr *ThisAttr = &Attrs->PrimAttrs[i];
        bool Array;
        DataType Type;
        lf_BreakdownTypeArray(ThisAttr->Name, Type, Array);
        const char *Name = &ThisAttr->Name[1];
        if (Array)
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(Name, (T *)ThisAttr->Values,                             \
                                          ThisAttr->TotalElementSize / DataTypeSize[(int)Type],    \
                                          "", "/", true);                                          \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
        else
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(Name, *(T *)ThisAttr->Values, "", "/", true);            \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
    }